

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SurfaceDiffusion.cpp
# Opt level: O0

void __thiscall OpenMD::SurfaceDiffusion::positionCorrelation(SurfaceDiffusion *this)

{
  int iVar1;
  ulong uVar2;
  double dVar3;
  bool bVar4;
  reference pvVar5;
  size_type sVar6;
  double *pdVar7;
  reference pvVar8;
  reference pvVar9;
  long in_RDI;
  double dVar10;
  size_t i_1;
  size_t k;
  int j;
  int frames;
  size_t i;
  int frameResize;
  Vector3d jPos;
  Vector3d kPos;
  int timeShift;
  RealType rDist;
  RealType yDist;
  RealType xDist;
  Vector3<double> *in_stack_fffffffffffffed8;
  Vector<double,_3U> *in_stack_fffffffffffffee0;
  value_type vVar11;
  Vector<double,_3U> *in_stack_fffffffffffffee8;
  size_type in_stack_fffffffffffffef8;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff00;
  ulong local_a8;
  ulong local_88;
  reference local_80;
  int local_70;
  int local_6c;
  ulong local_68;
  undefined4 local_5c;
  Vector3<double> local_58;
  Vector3<double> local_40;
  int local_24;
  double local_20;
  double local_18;
  double local_10;
  
  local_10 = 0.0;
  local_18 = 0.0;
  local_20 = 0.0;
  local_24 = 0;
  Vector3<double>::Vector3((Vector3<double> *)0x1d4958);
  Vector3<double>::Vector3((Vector3<double> *)0x1d4965);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x1d4976);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x1d4987);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x1d4998);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x1d49a9);
  pvVar5 = std::
           vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
           ::operator[]((vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
                         *)(in_RDI + 0x760),0);
  sVar6 = std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::size
                    (pvVar5);
  local_5c = (undefined4)sVar6;
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff00,
             in_stack_fffffffffffffef8);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff00,
             in_stack_fffffffffffffef8);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff00,
             in_stack_fffffffffffffef8);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff00,
             in_stack_fffffffffffffef8);
  for (local_68 = 0; uVar2 = local_68,
      sVar6 = std::
              vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
              ::size((vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
                      *)(in_RDI + 0x760)), uVar2 < sVar6; local_68 = local_68 + 1) {
    pvVar5 = std::
             vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
             ::operator[]((vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
                           *)(in_RDI + 0x760),local_68);
    sVar6 = std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::size
                      (pvVar5);
    local_6c = (int)sVar6 + -1;
    for (local_70 = 0; local_70 < local_6c; local_70 = local_70 + 1) {
      std::
      vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
      ::operator[]((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                    *)(in_RDI + 0x790),local_68);
      local_80 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      bVar4 = std::_Bit_reference::operator_cast_to_bool(&local_80);
      if (bVar4) {
        local_88 = (ulong)local_70;
        while( true ) {
          pvVar5 = std::
                   vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
                   ::operator[]((vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
                                 *)(in_RDI + 0x760),0);
          sVar6 = std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
                  size(pvVar5);
          if (sVar6 <= local_88) break;
          pvVar5 = std::
                   vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
                   ::operator[]((vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
                                 *)(in_RDI + 0x760),local_68);
          std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
          operator[](pvVar5,local_88);
          Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
          pvVar5 = std::
                   vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
                   ::operator[]((vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
                                 *)(in_RDI + 0x760),local_68);
          std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
          operator[](pvVar5,(long)local_70);
          Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
          pdVar7 = Vector3<double>::x(&local_40);
          dVar10 = *pdVar7;
          pdVar7 = Vector3<double>::x(&local_58);
          local_10 = (dVar10 - *pdVar7) * (dVar10 - *pdVar7);
          pdVar7 = Vector3<double>::y(&local_40);
          dVar10 = *pdVar7;
          pdVar7 = Vector3<double>::y(&local_58);
          local_18 = (dVar10 - *pdVar7) * (dVar10 - *pdVar7);
          OpenMD::operator-(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
          local_20 = Vector<double,_3U>::lengthSquare((Vector<double,_3U> *)0x1d4c96);
          dVar10 = local_10;
          local_24 = (int)local_88 - local_70;
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x898),
                              (long)local_24);
          dVar3 = local_18;
          *pvVar8 = dVar10 + *pvVar8;
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x8b0),
                              (long)local_24);
          dVar10 = local_20;
          *pvVar8 = dVar3 + *pvVar8;
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x8c8),
                              (long)local_24);
          *pvVar8 = dVar10 + *pvVar8;
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x880),(long)local_24);
          *pvVar9 = *pvVar9 + 1;
          local_88 = local_88 + 1;
        }
      }
    }
  }
  std::operator<<((ostream *)&std::cout,"X, Y, R calculated\n");
  for (local_a8 = 0;
      sVar6 = std::vector<double,_std::allocator<double>_>::size
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x898)),
      local_a8 < sVar6; local_a8 = local_a8 + 1) {
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x898),local_a8);
    vVar11 = *pvVar8;
    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x880),local_a8);
    dVar10 = vVar11 / (double)*pvVar9;
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x898),local_a8);
    *pvVar8 = dVar10;
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x8b0),local_a8);
    dVar10 = *pvVar8;
    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x880),local_a8);
    dVar10 = dVar10 / (double)*pvVar9;
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x8b0),local_a8);
    *pvVar8 = dVar10;
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x8c8),local_a8);
    vVar11 = *pvVar8;
    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x880),local_a8);
    iVar1 = *pvVar9;
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x8c8),local_a8);
    *pvVar8 = vVar11 / (double)iVar1;
  }
  std::operator<<((ostream *)&std::cout,"X, Y, R normalized\n");
  return;
}

Assistant:

void SurfaceDiffusion::positionCorrelation() {
    RealType xDist = 0.0;
    RealType yDist = 0.0;
    RealType rDist = 0.0;
    int timeShift  = 0;
    Vector3d kPos;
    Vector3d jPos;
    // biggest timeShift is positions2_[0].size() - 1?
    xHist_.clear();
    yHist_.clear();
    rHist_.clear();
    count_.clear();
    int frameResize = positions2_[0].size();
    xHist_.resize(frameResize);
    yHist_.resize(frameResize);
    rHist_.resize(frameResize);
    count_.resize(frameResize);
    // loop over particles
    // loop over frames starting at j
    //  loop over frames starting at k = j (time shift of 0)
    for (std::size_t i = 0; i < positions2_.size(); i++) {
      int frames = positions2_[i].size() - 1;  // for counting
                                               // properly, otherwise
                                               // moBool2_[i][j+1] will
                                               // go over
      for (int j = 0; j < frames; j++) {
        // if the particle is mobile between j and j + 1, then count
        // it for all timeShifts
        if (moBool2_[i][j + 1]) {
          for (std::size_t k = j; k < positions2_[0].size(); k++) {
            //<x(t)-x(0)>  <y(t)-y(0)>  <r(t)-r(0)>
            // The positions stored are not wrapped, thus I don't need
            // to worry about pbc
            // Mean square displacement
            // So I do want the squared distances

            kPos  = positions2_[i][k];
            jPos  = positions2_[i][j];
            xDist = kPos.x() - jPos.x();
            xDist = xDist * xDist;

            yDist = kPos.y() - jPos.y();
            yDist = yDist * yDist;

            rDist = (kPos - jPos).lengthSquare();

            timeShift = k - j;
            xHist_[timeShift] += xDist;
            yHist_[timeShift] += yDist;
            rHist_[timeShift] += rDist;
            count_[timeShift]++;
          }
        }
      }
    }
    cout << "X, Y, R calculated\n";

    for (std::size_t i = 0; i < xHist_.size(); i++) {
      xHist_[i] = xHist_[i] / (count_[i]);
      yHist_[i] = yHist_[i] / (count_[i]);
      rHist_[i] = rHist_[i] / (count_[i]);
    }
    cout << "X, Y, R normalized\n";
  }